

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 computeNumericType(Mem *pMem)

{
  int iVar1;
  u8 in_stack_0000002b;
  int in_stack_0000002c;
  i64 *in_stack_00000030;
  char *in_stack_00000038;
  u8 in_stack_000000bb;
  int in_stack_000000bc;
  double *in_stack_000000c0;
  char *in_stack_000000c8;
  undefined2 local_2;
  
  iVar1 = sqlite3AtoF(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000bb);
  if (iVar1 == 0) {
    local_2 = 0;
  }
  else {
    iVar1 = sqlite3Atoi64(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_0000002b);
    if (iVar1 == 0) {
      local_2 = 4;
    }
    else {
      local_2 = 8;
    }
  }
  return local_2;
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  assert( (pMem->flags & (MEM_Int|MEM_Real))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  if( sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc)==0 ){
    return 0;
  }
  if( sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc)==0 ){
    return MEM_Int;
  }
  return MEM_Real;
}